

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_no_mac.c
# Opt level: O0

int32_t ll_header_enabled_set(uint8_t enabled)

{
  int32_t iVar1;
  uint8_t enabled_local;
  
  iVar1 = ll_radio_params_set(' ','\0','\0','\0',0,0,enabled,'\0','\0');
  return iVar1;
}

Assistant:

int32_t ll_header_enabled_set(uint8_t enabled)
{
    return ll_radio_params_set(RADIO_PARAM_FLAGS_HEADER, 0, 0, 0, 0, 0, enabled, 0, 0);
}